

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O1

size_t GetEncodingCharSize(char *encoding)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = strncasecmp(encoding,"UCS-2",5);
  sVar2 = 2;
  if (iVar1 != 0) {
    iVar1 = strncasecmp(encoding,"UTF-16",6);
    if (iVar1 != 0) {
      iVar1 = strncasecmp(encoding,"UCS-4",5);
      if (iVar1 == 0) {
        sVar2 = 4;
      }
      else {
        iVar1 = strncasecmp(encoding,"UTF-32",6);
        sVar2 = (ulong)(iVar1 == 0) * 3 + 1;
      }
    }
  }
  return sVar2;
}

Assistant:

static size_t GetEncodingCharSize(const char* encoding)
{
	if (! strnicmp(encoding, "UCS-2", 5) || ! strnicmp(encoding, "UTF-16", 6))
		return sizeof(UINT16);
	else if (! strnicmp(encoding, "UCS-4", 5) || ! strnicmp(encoding, "UTF-32", 6))
		return sizeof(UINT32);
	else
		return sizeof(char);
}